

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

void __thiscall GlobOpt::InsertNoImplicitCallUses(GlobOpt *this,Instr *instr)

{
  int index;
  int iVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  OpndList *pOVar5;
  Instr *this_00;
  PragmaInstr *this_01;
  Type *ppOVar6;
  int index_00;
  
  pOVar5 = this->noImplicitCallUsesToInsert;
  if (pOVar5 == (OpndList *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3536,"(noImplicitCallUsesToInsert)","noImplicitCallUsesToInsert");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
    pOVar5 = this->noImplicitCallUsesToInsert;
  }
  iVar1 = (pOVar5->super_ReadOnlyList<IR::Opnd_*,_Memory::JitArenaAllocator,_DefaultComparer>).count
  ;
  if (iVar1 != 0) {
    this_00 = IR::Instr::GetInsertBeforeByteCodeUsesInstr(instr);
    index_00 = 0;
    while( true ) {
      if (iVar1 <= index_00) break;
      this_01 = IR::PragmaInstr::New(NoImplicitCallUses,0,instr->m_func);
      ppOVar6 = JsUtil::
                List<IR::Opnd_*,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item(this->noImplicitCallUsesToInsert,index_00);
      IR::Instr::SetSrc1(&this_01->super_Instr,*ppOVar6);
      IR::Opnd::SetIsJITOptimizedReg((this_01->super_Instr).m_src1,true);
      index = index_00 + 1;
      if (index < iVar1) {
        ppOVar6 = JsUtil::
                  List<IR::Opnd_*,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  ::Item(this->noImplicitCallUsesToInsert,index);
        IR::Instr::SetSrc2(&this_01->super_Instr,*ppOVar6);
        IR::Opnd::SetIsJITOptimizedReg((this_01->super_Instr).m_src2,true);
        index = index_00 + 2;
      }
      index_00 = index;
      IR::Instr::SetByteCodeOffset(&this_01->super_Instr,instr);
      IR::Instr::InsertBefore(this_00,&this_01->super_Instr);
    }
    (this->noImplicitCallUsesToInsert->
    super_ReadOnlyList<IR::Opnd_*,_Memory::JitArenaAllocator,_DefaultComparer>).count = 0;
  }
  return;
}

Assistant:

void
GlobOpt::InsertNoImplicitCallUses(IR::Instr *const instr)
{
    Assert(noImplicitCallUsesToInsert);

    const int n = noImplicitCallUsesToInsert->Count();
    if(n == 0)
    {
        return;
    }

    IR::Instr *const insertBeforeInstr = instr->GetInsertBeforeByteCodeUsesInstr();
    for(int i = 0; i < n;)
    {
        IR::Instr *const noImplicitCallUses = IR::PragmaInstr::New(Js::OpCode::NoImplicitCallUses, 0, instr->m_func);
        noImplicitCallUses->SetSrc1(noImplicitCallUsesToInsert->Item(i));
        noImplicitCallUses->GetSrc1()->SetIsJITOptimizedReg(true);
        ++i;
        if(i < n)
        {
            noImplicitCallUses->SetSrc2(noImplicitCallUsesToInsert->Item(i));
            noImplicitCallUses->GetSrc2()->SetIsJITOptimizedReg(true);
            ++i;
        }
        noImplicitCallUses->SetByteCodeOffset(instr);
        insertBeforeInstr->InsertBefore(noImplicitCallUses);
    }
    noImplicitCallUsesToInsert->Clear();
}